

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Gia_Man_t * Mf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Mem_t *pVVar4;
  char *pcVar5;
  word *pwVar6;
  Jf_Par_t *pJVar7;
  bool bVar8;
  int iVar9;
  Gia_Man_t *pGia_00;
  Mf_Man_t *p;
  FILE *__stream;
  Gia_Man_t *p_00;
  Cnf_Dat_t *pCVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  char pFileName [1000];
  char local_418 [1000];
  
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
  }
  if (pGia->pSibls != (int *)0x0) {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  pGia_00 = pGia;
  if (pPars->fCoarsen != 0) {
    pGia_00 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p = Mf_ManAlloc(pGia_00,pPars);
  p->pGia0 = pGia;
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGia_00);
    putchar(10);
  }
  Mf_ManPrintInit(p);
  Mf_ManComputeCuts(p);
  p->Iter = 1;
  if (1 < p->pPars->nRounds) {
    do {
      Mf_ManComputeMapping(p);
      iVar9 = p->Iter + 1;
      p->Iter = iVar9;
    } while (iVar9 < p->pPars->nRounds);
  }
  p->fUseEla = 1;
  if (p->Iter < pPars->nRoundsEla + p->pPars->nRounds) {
    do {
      Mf_ManComputeMapping(p);
      iVar9 = p->Iter + 1;
      p->Iter = iVar9;
    } while (iVar9 < pPars->nRoundsEla + p->pPars->nRounds);
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    pVVar4 = p->vTtMem;
    pcVar5 = p->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar5);
    __stream = _stdout;
    if (pcVar5 != (char *)0x0) {
      __stream = fopen(local_418,"wb");
    }
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar4->nEntries);
    }
    if (0 < pVVar4->nEntries) {
      uVar13 = 0;
      do {
        pwVar6 = pVVar4->ppPages[uVar13 >> ((byte)pVVar4->LogPageSze & 0x1f)];
        if (pwVar6 == (word *)0x0) break;
        uVar2 = pVVar4->nEntrySize;
        if (0 < (int)uVar2) {
          uVar3 = pVVar4->PageMask;
          uVar14 = (ulong)uVar2;
          do {
            lVar15 = 0x3c;
            do {
              uVar12 = (uint)(pwVar6[(long)(int)((uVar3 & uVar13) * uVar2) + (uVar14 - 1)] >>
                             ((byte)lVar15 & 0x3f)) & 0xf;
              if (uVar12 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar12 + 0x37,__stream);
              }
              lVar15 = lVar15 + -4;
            } while (lVar15 != -4);
            bVar8 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar8);
        }
        fputc(10,__stream);
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < pVVar4->nEntries);
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar11 = local_418;
    if (pcVar5 == (char *)0x0) {
      pcVar11 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar4->nEntrySize * (double)pVVar4->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)pVVar4->nEntries,(ulong)uVar1,pcVar11);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_00 = Mf_ManDeriveMapping(p);
    }
    else {
      p_00 = Mf_ManDeriveMappingCoarse(p);
    }
  }
  else {
    p_00 = Mf_ManDeriveMappingGia(p);
  }
  pJVar7 = p->pPars;
  if (pJVar7->fGenCnf != 0) {
    pCVar10 = Mf_ManDeriveCnf(p,pJVar7->fCnfObjIds,pJVar7->fAddOrCla);
    pGia->pData = pCVar10;
  }
  Gia_ManMappingVerify(p_00);
  Mf_ManPrintQuit(p,p_00);
  Mf_ManFree(p);
  if (pGia_00 != pGia) {
    Gia_ManStop(pGia_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Mf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCutMin = 1, pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Mf_ManAlloc( pCls, pPars );
    p->pGia0 = pGia;
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Mf_ManPrintInit( p );
    Mf_ManComputeCuts( p );
    for ( p->Iter = 1; p->Iter < p->pPars->nRounds; p->Iter++ )
        Mf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Mf_ManComputeMapping( p );
    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Mf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Mf_ManDeriveMappingCoarse( p );
    else
        pNew = Mf_ManDeriveMapping( p );
    if ( p->pPars->fGenCnf )
        pGia->pData = Mf_ManDeriveCnf( p, p->pPars->fCnfObjIds, p->pPars->fAddOrCla );
//    if ( p->pPars->fGenCnf )
//        Mf_ManProfileTruths( p );
    Gia_ManMappingVerify( pNew );
    Mf_ManPrintQuit( p, pNew );
    Mf_ManFree( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    return pNew;
}